

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::bufferDefinition::~bufferDefinition(bufferDefinition *this)

{
  if (this->m_buffer_object_id != 0xffffffff) {
    if (this->m_gl != (Functions *)0x0) {
      (*this->m_gl->deleteBuffers)(1,&this->m_buffer_object_id);
      this->m_gl = (Functions *)0x0;
    }
    this->m_buffer_object_id = 0xffffffff;
  }
  return;
}

Assistant:

TextureCubeMapArraySamplingTest::bufferDefinition::~bufferDefinition()
{
	if (m_invalid_buffer_object_id != m_buffer_object_id)
	{
		if (0 != m_gl)
		{
			m_gl->deleteBuffers(1, &m_buffer_object_id);

			m_gl = 0;
		}

		m_buffer_object_id = m_invalid_buffer_object_id;
	}
}